

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void export_results(double **results,uint total_experiments)

{
  time_t tStack_200a8;
  time_t timer;
  tm *time_info;
  char result_to_string [131072];
  char time_representation [64];
  char filename [64];
  uint total_experiments_local;
  double **results_local;
  
  memset(time_representation + 0x38,0,0x40);
  memset(result_to_string + 0x1fff8,0,0x40);
  memset(&time_info,0,0x20000);
  tStack_200a8 = time((time_t *)0x0);
  timer = (time_t)localtime(&tStack_200a8);
  strftime(result_to_string + 0x1fff8,0x40,"%G_%b_%d_%H-%M-%S",(tm *)timer);
  export_results_to_string(results,total_experiments,(char *)&time_info);
  mkdir("results",0x1c0);
  snprintf(time_representation + 0x38,0x40,"results/%s_results.csv",result_to_string + 0x1fff8);
  rewrite_file(time_representation + 0x38,(char *)&time_info);
  return;
}

Assistant:

void export_results (double *const * results, unsigned total_experiments) {
  char filename[MAX_FILENAME_SIZE] = "";
  char time_representation[MAX_FILENAME_SIZE] = "";
  char result_to_string[MAX_BUFFER_SIZE] = "";

  struct tm * time_info;
  time_t timer = time(NULL);

  time_info = localtime (&timer);
  strftime (time_representation, MAX_FILENAME_SIZE, "%G_%b_%d_%H-%M-%S", time_info);

  export_results_to_string (results, total_experiments, result_to_string);
  // might be cross-platform issues
  mkdir ("results", S_IRWXU);
  snprintf (filename, MAX_FILENAME_SIZE, "results/%s_results.csv", time_representation);

  rewrite_file (filename, result_to_string);

#ifdef ALTERNATIVE_OUTPUT
  printf(FANCY_INFO "Results saved to file `%s'.\n", filename);
#endif /* ALTERNATIVE_OUTPUT */

  return;
}